

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  bool bVar1;
  int i32;
  string *psVar2;
  Descriptor *this_00;
  FieldDescriptor *pFVar3;
  AlphaNum *a;
  AlphaNum local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_39;
  undefined1 local_38 [8];
  string field_name;
  FieldDescriptor *field_local;
  string *result;
  
  field_name.field_2._8_8_ = this;
  psVar2 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)this);
  UnderscoresToCamelCase((string *)local_38,psVar2,true);
  local_39 = 0;
  std::operator+(&local_60,"k",(string *)local_38);
  std::operator+(__return_storage_ptr__,&local_60,"FieldNumber");
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)field_name.field_2._8_8_);
  if (!bVar1) {
    this_00 = FieldDescriptor::containing_type((FieldDescriptor *)field_name.field_2._8_8_);
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_((FieldDescriptor *)field_name.field_2._8_8_)
    ;
    pFVar3 = Descriptor::FindFieldByCamelcaseName(this_00,psVar2);
    if (pFVar3 != (FieldDescriptor *)field_name.field_2._8_8_) {
      i32 = FieldDescriptor::number((FieldDescriptor *)field_name.field_2._8_8_);
      strings::AlphaNum::AlphaNum(&local_e0,i32);
      StrCat_abi_cxx11_(&local_b0,(protobuf *)&local_e0,a);
      std::operator+(&local_90,"_",&local_b0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  local_39 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldConstantName(const FieldDescriptor* field) {
  std::string field_name = UnderscoresToCamelCase(field->name(), true);
  std::string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
          field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + StrCat(field->number());
  }

  return result;
}